

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void compile_finish(c2m_ctx_t c2m_ctx)

{
  pre_ctx *ppVar1;
  pre_ctx *ppVar2;
  VARR_token_t *pVVar3;
  HTAB_macro_t *pHVar4;
  FILE *pFVar5;
  VARR_htab_ind_t *pVVar6;
  parse_ctx *ppVar7;
  HTAB_tpname_t *pHVar8;
  check_ctx *pcVar9;
  HTAB_symbol_t *pHVar10;
  HTAB_case_t *pHVar11;
  VARR_decl_t *__ptr;
  VARR_node_t *pVVar12;
  VARR_char_ptr_t *pVVar13;
  VARR_init_object_t *__ptr_00;
  FILE *__stream;
  uint uVar14;
  stream_t psVar15;
  stream_t *__ptr_01;
  MIR_context_t in_RCX;
  ulong uVar16;
  char *fname;
  code *pcVar17;
  MIR_context_t pMVar18;
  FILE *in_RSI;
  c2m_ctx_t pcVar19;
  c2m_ctx_t __ptr_02;
  c2m_ctx_t pcVar20;
  c2m_ctx_t pcVar21;
  tpname_t *ptVar22;
  symbol_t *psVar23;
  VARR_ifstate_t *__ptr_03;
  VARR_macro_call_t *__ptr_04;
  VARR_stream_t *pVVar24;
  size_t sVar25;
  
  pcVar19 = (c2m_ctx_t)c2m_ctx->symbol_text;
  pcVar21 = c2m_ctx;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar20 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar20 != (c2m_ctx_t)0x0) {
      free(pcVar20);
      free(pcVar19);
      c2m_ctx->symbol_text = (VARR_char *)0x0;
      pcVar21 = pcVar19;
      goto LAB_001778ea;
    }
LAB_0017825a:
    compile_finish_cold_1();
LAB_0017825f:
    compile_finish_cold_2();
LAB_00178264:
    compile_finish_cold_3();
LAB_00178269:
    compile_finish_cold_40();
LAB_0017826e:
    compile_finish_cold_41();
LAB_00178273:
    compile_finish_cold_42();
LAB_00178278:
    compile_finish_cold_43();
LAB_0017827d:
    compile_finish_cold_44();
LAB_00178282:
    pcVar21 = pcVar20;
    compile_finish_cold_17();
LAB_00178287:
    compile_finish_cold_16();
LAB_0017828c:
    compile_finish_cold_4();
LAB_00178291:
    compile_finish_cold_5();
LAB_00178296:
    compile_finish_cold_30();
LAB_0017829b:
    compile_finish_cold_31();
LAB_001782a0:
    compile_finish_cold_38();
LAB_001782a5:
    compile_finish_cold_39();
    goto LAB_001782aa;
  }
LAB_001778ea:
  pcVar19 = (c2m_ctx_t)c2m_ctx->temp_string;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar20 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar20 != (c2m_ctx_t)0x0) {
      free(pcVar20);
      free(pcVar19);
      c2m_ctx->temp_string = (VARR_char *)0x0;
      pcVar21 = pcVar19;
      goto LAB_0017791b;
    }
    goto LAB_0017825f;
  }
LAB_0017791b:
  pcVar19 = (c2m_ctx_t)c2m_ctx->node_positions;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar20 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar20 != (c2m_ctx_t)0x0) {
      free(pcVar20);
      free(pcVar19);
      c2m_ctx->node_positions = (VARR_pos_t *)0x0;
      pcVar21 = pcVar19;
      goto LAB_0017794c;
    }
    goto LAB_00178264;
  }
LAB_0017794c:
  if (c2m_ctx->parse_ctx == (parse_ctx *)0x0) goto LAB_00177e8f;
  pcVar19 = (c2m_ctx_t)c2m_ctx->recorded_tokens;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar21 != (c2m_ctx_t)0x0) {
      free(pcVar21);
      free(pcVar19);
      c2m_ctx->recorded_tokens = (VARR_token_t *)0x0;
      pcVar21 = pcVar19;
      goto LAB_0017798b;
    }
    goto LAB_0017828c;
  }
LAB_0017798b:
  pcVar19 = (c2m_ctx_t)c2m_ctx->buffered_tokens;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar21 != (c2m_ctx_t)0x0) {
      free(pcVar21);
      free(pcVar19);
      c2m_ctx->buffered_tokens = (VARR_token_t *)0x0;
      pcVar21 = pcVar19;
      goto LAB_001779bc;
    }
    goto LAB_00178291;
  }
LAB_001779bc:
  ppVar1 = c2m_ctx->pre_ctx;
  if (ppVar1 == (pre_ctx *)0x0) {
LAB_00177ce2:
    ppVar7 = c2m_ctx->parse_ctx;
    pHVar8 = ppVar7->tpname_tab;
    if (pHVar8 == (HTAB_tpname_t *)0x0) {
LAB_00177e0e:
      if (c2m_ctx->eof_s != (stream_t)0x0) {
        free_stream(c2m_ctx->eof_s);
      }
      pVVar24 = c2m_ctx->streams;
      if (pVVar24 != (VARR_stream_t *)0x0) {
LAB_00177e2b:
        sVar25 = pVVar24->els_num;
        pcVar21 = (c2m_ctx_t)pVVar24->varr;
        if (sVar25 != 0) {
          if (pcVar21 != (c2m_ctx_t)0x0) goto code_r0x00177e40;
          compile_finish_cold_28();
LAB_00178228:
          compile_finish_cold_12();
LAB_0017822d:
          compile_finish_cold_21();
LAB_00178232:
          compile_finish_cold_10();
LAB_00178237:
          compile_finish_cold_9();
          goto LAB_0017823c;
        }
        goto LAB_00177e62;
      }
      goto LAB_00177e83;
    }
    if (pHVar8->free_func == (_func_void_tpname_t_void_ptr *)0x0) {
LAB_00177d98:
      pHVar8 = ppVar7->tpname_tab;
      pcVar20 = (c2m_ctx_t)pHVar8->els;
      if ((pcVar20 == (c2m_ctx_t)0x0) ||
         (pcVar21 = (c2m_ctx_t)pcVar20->env[0].__jmpbuf[0], pcVar21 == (c2m_ctx_t)0x0))
      goto LAB_0017824b;
      free(pcVar21);
      free(pcVar20);
      pHVar8->els = (VARR_HTAB_EL_tpname_t *)0x0;
      pHVar8 = ppVar7->tpname_tab;
      pVVar6 = pHVar8->entries;
      if ((pVVar6 != (VARR_htab_ind_t *)0x0) &&
         (pcVar20 = (c2m_ctx_t)pVVar6->varr, pcVar20 != (c2m_ctx_t)0x0)) {
        free(pcVar20);
        free(pVVar6);
        pHVar8->entries = (VARR_htab_ind_t *)0x0;
        free(ppVar7->tpname_tab);
        ppVar7->tpname_tab = (HTAB_tpname_t *)0x0;
        goto LAB_00177e0e;
      }
      goto LAB_00178255;
    }
    in_RCX = (MIR_context_t)pHVar8->els;
    if (in_RCX == (MIR_context_t)0x0) goto LAB_001782c8;
    uVar14 = pHVar8->els_bound;
    if (uVar14 != 0) {
      pcVar19 = (c2m_ctx_t)pHVar8->arg;
      pMVar18 = (MIR_context_t)0x0;
      ptVar22 = (tpname_t *)(in_RCX->error_func + 8);
      do {
        if (ptVar22[-1].typedef_p != 0) {
          pcVar21 = pcVar19;
          (*pHVar8->free_func)(*ptVar22,pcVar19);
          uVar14 = pHVar8->els_bound;
        }
        pMVar18 = (MIR_context_t)((long)&pMVar18->gen_ctx + 1);
        ptVar22 = (tpname_t *)&ptVar22[1].scope;
        in_RCX = (MIR_context_t)(ulong)uVar14;
      } while (pMVar18 < in_RCX);
    }
    pHVar8->els_bound = 0;
    pHVar8->els_num = 0;
    pHVar8->els_start = 0;
    pVVar6 = pHVar8->entries;
    if (pVVar6 != (VARR_htab_ind_t *)0x0) {
      in_RCX = (MIR_context_t)pVVar6->els_num;
      if ((int)in_RCX != 0) {
        pcVar21 = (c2m_ctx_t)pVVar6->varr;
        in_RSI = (FILE *)0xff;
        memset(pcVar21,0xff,((ulong)in_RCX & 0xffffffff) << 2);
      }
      goto LAB_00177d98;
    }
    goto LAB_001782cd;
  }
  pcVar19 = (c2m_ctx_t)ppVar1->once_include_files;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar21 != (c2m_ctx_t)0x0) {
      free(pcVar21);
      free(pcVar19);
      ppVar1->once_include_files = (VARR_char_ptr_t *)0x0;
      pcVar21 = pcVar19;
      goto LAB_001779f7;
    }
    goto LAB_001782af;
  }
LAB_001779f7:
  pcVar19 = (c2m_ctx_t)ppVar1->temp_tokens;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar21 != (c2m_ctx_t)0x0) {
      free(pcVar21);
      free(pcVar19);
      ppVar1->temp_tokens = (VARR_token_t *)0x0;
      pcVar21 = pcVar19;
      goto LAB_00177a24;
    }
    goto LAB_001782b4;
  }
LAB_00177a24:
  pcVar19 = (c2m_ctx_t)ppVar1->output_buffer;
  pcVar20 = pcVar21;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
    if (pcVar21 != (c2m_ctx_t)0x0) {
      free(pcVar21);
      free(pcVar19);
      ppVar1->output_buffer = (VARR_token_t *)0x0;
      pcVar20 = pcVar19;
      goto LAB_00177a57;
    }
    goto LAB_001782b9;
  }
LAB_00177a57:
  ppVar2 = c2m_ctx->pre_ctx;
  pcVar19 = (c2m_ctx_t)ppVar2->macros;
  if (pcVar19 != (c2m_ctx_t)0x0) {
    do {
      pMVar18 = pcVar19->ctx;
      __ptr_02 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
      pcVar20 = pcVar19;
      if (pMVar18 == (MIR_context_t)0x0) goto LAB_00177af0;
      pcVar21 = __ptr_02;
      if (__ptr_02 == (c2m_ctx_t)0x0) goto LAB_00178228;
      in_RCX = (MIR_context_t)((long)&pMVar18[-1].wrapper_end_addr + 7);
      pcVar19->ctx = in_RCX;
      __ptr_02 = (c2m_ctx_t)
                 __ptr_02->env[0].__jmpbuf[(long)((long)&pMVar18[-1].wrapper_end_addr + 5)];
      pVVar3 = (VARR_token_t *)((pos_t *)&__ptr_02->options)->fname;
      if (pVVar3 != (VARR_token_t *)0x0) {
        pcVar21 = (c2m_ctx_t)pVVar3->varr;
        if (pcVar21 == (c2m_ctx_t)0x0) goto LAB_00178237;
        free(pcVar21);
        free(pVVar3);
        ((pos_t *)&__ptr_02->options)->fname = (char *)0x0;
      }
      pVVar3 = (VARR_token_t *)__ptr_02->env[0].__jmpbuf[0];
      if (pVVar3 != (VARR_token_t *)0x0) {
        pcVar21 = (c2m_ctx_t)pVVar3->varr;
        if (pcVar21 == (c2m_ctx_t)0x0) goto LAB_00178232;
        free(pcVar21);
        free(pVVar3);
      }
      free(__ptr_02);
      pcVar19 = (c2m_ctx_t)ppVar2->macros;
    } while (pcVar19 != (c2m_ctx_t)0x0);
    compile_finish_cold_11();
    pcVar20 = pcVar19;
LAB_00177af0:
    pcVar21 = __ptr_02;
    if (__ptr_02 != (c2m_ctx_t)0x0) {
      free(__ptr_02);
      free(pcVar20);
      ppVar2->macros = (VARR_macro_t *)0x0;
      goto LAB_00177b0e;
    }
    goto LAB_001782d7;
  }
LAB_00177b0e:
  pHVar4 = ppVar2->macro_tab;
  if (pHVar4 == (HTAB_macro_t *)0x0) {
LAB_00177c1d:
    __ptr_03 = ppVar1->ifs;
    if (__ptr_03 != (VARR_ifstate_t *)0x0) {
      do {
        if (__ptr_03->els_num == 0) goto LAB_00177c4c;
        pop_ifstate((c2m_ctx_t)c2m_ctx->pre_ctx->ifs);
        __ptr_03 = ppVar1->ifs;
      } while (__ptr_03 != (VARR_ifstate_t *)0x0);
      compile_finish_cold_18();
LAB_00177c4c:
      pcVar21 = (c2m_ctx_t)__ptr_03->varr;
      if (pcVar21 != (c2m_ctx_t)0x0) {
        free(pcVar21);
        free(__ptr_03);
        ppVar1->ifs = (VARR_ifstate_t *)0x0;
        goto LAB_00177c6f;
      }
      goto LAB_001782d2;
    }
LAB_00177c6f:
    __ptr_04 = ppVar1->macro_call_stack;
    if (__ptr_04 == (VARR_macro_call_t *)0x0) {
LAB_00177cd6:
      pcVar21 = (c2m_ctx_t)c2m_ctx->pre_ctx;
      free(pcVar21);
      goto LAB_00177ce2;
    }
    do {
      sVar25 = __ptr_04->els_num;
      pcVar21 = (c2m_ctx_t)__ptr_04->varr;
      if (sVar25 == 0) goto LAB_00177cb4;
      if (pcVar21 == (c2m_ctx_t)0x0) goto LAB_0017822d;
      in_RCX = (MIR_context_t)(sVar25 - 1);
      __ptr_04->els_num = (size_t)in_RCX;
      pcVar21 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[sVar25 - 3];
      free_macro_call((macro_call_t)pcVar21);
      __ptr_04 = ppVar1->macro_call_stack;
    } while (__ptr_04 != (VARR_macro_call_t *)0x0);
    compile_finish_cold_20();
LAB_00177cb4:
    if (pcVar21 != (c2m_ctx_t)0x0) {
      free(pcVar21);
      free(__ptr_04);
      ppVar1->macro_call_stack = (VARR_macro_call_t *)0x0;
      goto LAB_00177cd6;
    }
    goto LAB_001782dc;
  }
  if (pHVar4->free_func == (_func_void_macro_t_void_ptr *)0x0) {
LAB_00177bab:
    pHVar4 = ppVar2->macro_tab;
    pcVar21 = (c2m_ctx_t)pHVar4->els;
    if ((pcVar21 == (c2m_ctx_t)0x0) ||
       (pcVar20 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[0], pcVar20 == (c2m_ctx_t)0x0))
    goto LAB_00178282;
    free(pcVar20);
    free(pcVar21);
    pHVar4->els = (VARR_HTAB_EL_macro_t *)0x0;
    pHVar4 = ppVar2->macro_tab;
    pVVar6 = pHVar4->entries;
    if ((pVVar6 != (VARR_htab_ind_t *)0x0) &&
       (pcVar21 = (c2m_ctx_t)pVVar6->varr, pcVar21 != (c2m_ctx_t)0x0)) {
      free(pcVar21);
      free(pVVar6);
      pHVar4->entries = (VARR_htab_ind_t *)0x0;
      free(ppVar2->macro_tab);
      ppVar2->macro_tab = (HTAB_macro_t *)0x0;
      goto LAB_00177c1d;
    }
    goto LAB_00178287;
  }
  in_RCX = (MIR_context_t)pHVar4->els;
  if (in_RCX != (MIR_context_t)0x0) {
    uVar14 = pHVar4->els_bound;
    if (uVar14 != 0) {
      pFVar5 = (FILE *)pHVar4->arg;
      pMVar18 = (MIR_context_t)0x0;
      pcVar17 = in_RCX->error_func + 8;
      do {
        if (*(int *)(pcVar17 + -8) != 0) {
          pcVar20 = *(c2m_ctx_t *)pcVar17;
          in_RSI = pFVar5;
          (*pHVar4->free_func)((macro_t)pcVar20,pFVar5);
          uVar14 = pHVar4->els_bound;
        }
        pMVar18 = (MIR_context_t)((long)&pMVar18->gen_ctx + 1);
        pcVar17 = pcVar17 + 0x10;
        in_RCX = (MIR_context_t)(ulong)uVar14;
      } while (pMVar18 < in_RCX);
    }
    pHVar4->els_bound = 0;
    pHVar4->els_num = 0;
    pHVar4->els_start = 0;
    pVVar6 = pHVar4->entries;
    if (pVVar6 == (VARR_htab_ind_t *)0x0) goto LAB_001782e6;
    in_RCX = (MIR_context_t)pVVar6->els_num;
    if ((int)in_RCX != 0) {
      pcVar20 = (c2m_ctx_t)pVVar6->varr;
      in_RSI = (FILE *)0xff;
      memset(pcVar20,0xff,((ulong)in_RCX & 0xffffffff) << 2);
    }
    goto LAB_00177bab;
  }
  goto LAB_001782e1;
code_r0x00177e40:
  in_RCX = (MIR_context_t)(sVar25 - 1);
  pVVar24->els_num = (size_t)in_RCX;
  pcVar21 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[sVar25 - 3];
  free_stream((stream_t)pcVar21);
  pVVar24 = c2m_ctx->streams;
  if (pVVar24 == (VARR_stream_t *)0x0) goto code_r0x00177e5d;
  goto LAB_00177e2b;
code_r0x00177e5d:
  compile_finish_cold_27();
LAB_00177e62:
  if (pcVar21 == (c2m_ctx_t)0x0) {
LAB_001782aa:
    compile_finish_cold_29();
LAB_001782af:
    compile_finish_cold_6();
LAB_001782b4:
    compile_finish_cold_7();
LAB_001782b9:
    compile_finish_cold_8();
LAB_001782be:
    compile_finish_cold_33();
  }
  else {
    free(pcVar21);
    free(pVVar24);
    c2m_ctx->streams = (VARR_stream_t *)0x0;
LAB_00177e83:
    pcVar21 = (c2m_ctx_t)c2m_ctx->parse_ctx;
    free(pcVar21);
LAB_00177e8f:
    pcVar9 = c2m_ctx->check_ctx;
    if (pcVar9 == (check_ctx *)0x0) {
LAB_0017811f:
      pVVar13 = c2m_ctx->headers;
      if (pVVar13 != (VARR_char_ptr_t *)0x0) {
        pcVar20 = (c2m_ctx_t)pVVar13->varr;
        if (pcVar20 != (c2m_ctx_t)0x0) {
          free(pcVar20);
          free(pVVar13);
          c2m_ctx->headers = (VARR_char_ptr_t *)0x0;
          goto LAB_00178150;
        }
        goto LAB_00178269;
      }
LAB_00178150:
      pVVar13 = c2m_ctx->system_headers;
      if (pVVar13 != (VARR_char_ptr_t *)0x0) {
        pcVar20 = (c2m_ctx_t)pVVar13->varr;
        if (pcVar20 != (c2m_ctx_t)0x0) {
          free(pcVar20);
          free(pVVar13);
          c2m_ctx->system_headers = (VARR_char_ptr_t *)0x0;
          goto LAB_00178181;
        }
        goto LAB_0017826e;
      }
LAB_00178181:
      pVVar12 = c2m_ctx->call_nodes;
      if (pVVar12 != (VARR_node_t *)0x0) {
        pcVar20 = (c2m_ctx_t)pVVar12->varr;
        if (pcVar20 != (c2m_ctx_t)0x0) {
          free(pcVar20);
          free(pVVar12);
          c2m_ctx->call_nodes = (VARR_node_t *)0x0;
          goto LAB_001781b2;
        }
        goto LAB_00178273;
      }
LAB_001781b2:
      pVVar12 = c2m_ctx->containing_anon_members;
      if (pVVar12 != (VARR_node_t *)0x0) {
        pcVar20 = (c2m_ctx_t)pVVar12->varr;
        if (pcVar20 != (c2m_ctx_t)0x0) {
          free(pcVar20);
          free(pVVar12);
          c2m_ctx->containing_anon_members = (VARR_node_t *)0x0;
          goto LAB_001781e3;
        }
        goto LAB_00178278;
      }
LAB_001781e3:
      __ptr_00 = c2m_ctx->init_object_path;
      if (__ptr_00 == (VARR_init_object_t *)0x0) {
        return;
      }
      pcVar20 = (c2m_ctx_t)__ptr_00->varr;
      if (pcVar20 != (c2m_ctx_t)0x0) {
        free(pcVar20);
        free(__ptr_00);
        c2m_ctx->init_object_path = (VARR_init_object_t *)0x0;
        return;
      }
      goto LAB_0017827d;
    }
    pcVar19 = (c2m_ctx_t)pcVar9->context_stack;
    if (pcVar19 != (c2m_ctx_t)0x0) {
      pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
      if (pcVar21 != (c2m_ctx_t)0x0) {
        free(pcVar21);
        free(pcVar19);
        pcVar9->context_stack = (VARR_node_t *)0x0;
        pcVar21 = pcVar19;
        goto LAB_00177ecc;
      }
      goto LAB_00178296;
    }
LAB_00177ecc:
    pcVar19 = (c2m_ctx_t)pcVar9->label_uses;
    if (pcVar19 != (c2m_ctx_t)0x0) {
      pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0];
      if (pcVar21 != (c2m_ctx_t)0x0) {
        free(pcVar21);
        free(pcVar19);
        pcVar9->label_uses = (VARR_node_t *)0x0;
        pcVar21 = pcVar19;
        goto LAB_00177ef9;
      }
      goto LAB_0017829b;
    }
LAB_00177ef9:
    pHVar10 = c2m_ctx->symbol_tab;
    if (pHVar10 == (HTAB_symbol_t *)0x0) {
LAB_00178026:
      pcVar20 = (c2m_ctx_t)pcVar9->case_tab;
      if (pcVar20 != (c2m_ctx_t)0x0) {
        pcVar19 = pcVar21;
        pcVar21 = pcVar20;
        if (pcVar20->env[0].__jmpbuf[3] != 0) {
          HTAB_case_t_clear((HTAB_case_t *)pcVar20);
          pcVar21 = (c2m_ctx_t)pcVar9->case_tab;
          pcVar19 = pcVar20;
        }
        pcVar20 = (c2m_ctx_t)((fpos_t *)(pcVar21->env[0].__jmpbuf + 4))->__pos;
        if ((pcVar20 == (c2m_ctx_t)0x0) ||
           (pcVar19 = (c2m_ctx_t)pcVar20->env[0].__jmpbuf[0], pcVar19 == (c2m_ctx_t)0x0))
        goto LAB_00178246;
        free(pcVar19);
        free(pcVar20);
        ((fpos_t *)(pcVar21->env[0].__jmpbuf + 4))->__pos = 0;
        pHVar11 = pcVar9->case_tab;
        pVVar6 = pHVar11->entries;
        if ((pVVar6 == (VARR_htab_ind_t *)0x0) ||
           (pcVar20 = (c2m_ctx_t)pVVar6->varr, pcVar20 == (c2m_ctx_t)0x0)) goto LAB_00178250;
        free(pcVar20);
        free(pVVar6);
        pHVar11->entries = (VARR_htab_ind_t *)0x0;
        free(pcVar9->case_tab);
        pcVar9->case_tab = (HTAB_case_t *)0x0;
      }
      __ptr = pcVar9->func_decls_for_allocation;
      if (__ptr != (VARR_decl_t *)0x0) {
        pcVar21 = (c2m_ctx_t)__ptr->varr;
        if (pcVar21 != (c2m_ctx_t)0x0) {
          free(pcVar21);
          free(__ptr);
          pcVar9->func_decls_for_allocation = (VARR_decl_t *)0x0;
          goto LAB_001780e6;
        }
        goto LAB_001782a0;
      }
LAB_001780e6:
      pVVar12 = pcVar9->possible_incomplete_decls;
      if (pVVar12 == (VARR_node_t *)0x0) {
LAB_00178113:
        free(c2m_ctx->check_ctx);
        goto LAB_0017811f;
      }
      pcVar21 = (c2m_ctx_t)pVVar12->varr;
      if (pcVar21 != (c2m_ctx_t)0x0) {
        free(pcVar21);
        free(pVVar12);
        pcVar9->possible_incomplete_decls = (VARR_node_t *)0x0;
        goto LAB_00178113;
      }
      goto LAB_001782a5;
    }
    if (pHVar10->free_func == (_func_void_symbol_t_void_ptr *)0x0) {
LAB_00177fa8:
      pHVar10 = c2m_ctx->symbol_tab;
      pcVar19 = (c2m_ctx_t)pHVar10->els;
      if ((pcVar19 == (c2m_ctx_t)0x0) ||
         (pcVar21 = (c2m_ctx_t)pcVar19->env[0].__jmpbuf[0], pcVar21 == (c2m_ctx_t)0x0)) {
LAB_0017823c:
        pcVar19 = pcVar21;
        compile_finish_cold_35();
      }
      else {
        free(pcVar21);
        free(pcVar19);
        pHVar10->els = (VARR_HTAB_EL_symbol_t *)0x0;
        pHVar10 = c2m_ctx->symbol_tab;
        pVVar6 = pHVar10->entries;
        if ((pVVar6 != (VARR_htab_ind_t *)0x0) &&
           (pcVar19 = (c2m_ctx_t)pVVar6->varr, pcVar19 != (c2m_ctx_t)0x0)) {
          free(pcVar19);
          free(pVVar6);
          pHVar10->entries = (VARR_htab_ind_t *)0x0;
          pcVar21 = (c2m_ctx_t)c2m_ctx->symbol_tab;
          free(pcVar21);
          c2m_ctx->symbol_tab = (HTAB_symbol_t *)0x0;
          goto LAB_00178026;
        }
      }
      compile_finish_cold_34();
LAB_00178246:
      compile_finish_cold_37();
      pcVar21 = pcVar19;
LAB_0017824b:
      pcVar20 = pcVar21;
      compile_finish_cold_26();
LAB_00178250:
      compile_finish_cold_36();
LAB_00178255:
      compile_finish_cold_25();
      goto LAB_0017825a;
    }
    in_RCX = (MIR_context_t)pHVar10->els;
    if (in_RCX == (MIR_context_t)0x0) goto LAB_001782be;
    uVar14 = pHVar10->els_bound;
    if (uVar14 != 0) {
      pcVar19 = (c2m_ctx_t)pHVar10->arg;
      pMVar18 = (MIR_context_t)0x0;
      psVar23 = (symbol_t *)(in_RCX->error_func + 8);
      do {
        if (*(int *)&psVar23[-1].defs != 0) {
          pcVar21 = pcVar19;
          (*pHVar10->free_func)(*psVar23,pcVar19);
          uVar14 = pHVar10->els_bound;
        }
        pMVar18 = (MIR_context_t)((long)&pMVar18->gen_ctx + 1);
        psVar23 = (symbol_t *)&psVar23[1].id;
        in_RCX = (MIR_context_t)(ulong)uVar14;
      } while (pMVar18 < in_RCX);
    }
    pHVar10->els_bound = 0;
    pHVar10->els_num = 0;
    pHVar10->els_start = 0;
    pVVar6 = pHVar10->entries;
    if (pVVar6 != (VARR_htab_ind_t *)0x0) {
      in_RCX = (MIR_context_t)pVVar6->els_num;
      if ((int)in_RCX != 0) {
        pcVar21 = (c2m_ctx_t)pVVar6->varr;
        in_RSI = (FILE *)0xff;
        memset(pcVar21,0xff,((ulong)in_RCX & 0xffffffff) << 2);
      }
      goto LAB_00177fa8;
    }
  }
  compile_finish_cold_32();
LAB_001782c8:
  compile_finish_cold_24();
LAB_001782cd:
  compile_finish_cold_23();
LAB_001782d2:
  compile_finish_cold_19();
LAB_001782d7:
  compile_finish_cold_13();
LAB_001782dc:
  compile_finish_cold_22();
  pcVar20 = pcVar21;
LAB_001782e1:
  compile_finish_cold_15();
LAB_001782e6:
  compile_finish_cold_14();
  if (fname == (char *)0x0) {
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3ad,"void add_stream(c2m_ctx_t, FILE *, const char *, int (*)(c2m_ctx_t))");
  }
  psVar15 = pcVar20->cs;
  if (((psVar15 != (stream_t)0x0) && (__stream = (FILE *)psVar15->f, __stream != (FILE *)0x0)) &&
     (__stream != _stdin)) {
    fgetpos(__stream,(fpos_t *)&psVar15->fpos);
    fclose((FILE *)pcVar20->cs->f);
    pcVar20->cs->f = (FILE *)0x0;
  }
  psVar15 = new_stream(in_RSI,fname,(_func_int_c2m_ctx_t *)in_RCX);
  pcVar20->cs = psVar15;
  pVVar24 = pcVar20->streams;
  __ptr_01 = pVVar24->varr;
  if (__ptr_01 == (stream_t *)0x0) {
    add_stream_cold_1();
    (**(code **)&in_RSI[1]._fileno)(in_RSI[1]._old_offset);
    return;
  }
  sVar25 = pVVar24->els_num;
  uVar16 = sVar25 + 1;
  if (pVVar24->size < uVar16) {
    sVar25 = (uVar16 >> 1) + uVar16;
    __ptr_01 = (stream_t *)realloc(__ptr_01,sVar25 * 8);
    pVVar24->varr = __ptr_01;
    pVVar24->size = sVar25;
    sVar25 = pVVar24->els_num;
    uVar16 = sVar25 + 1;
  }
  pVVar24->els_num = uVar16;
  __ptr_01[sVar25] = psVar15;
  return;
}

Assistant:

static void compile_finish (c2m_ctx_t c2m_ctx) {
  if (symbol_text != NULL) VARR_DESTROY (char, symbol_text);
  if (temp_string != NULL) VARR_DESTROY (char, temp_string);
  if (node_positions != NULL) VARR_DESTROY (pos_t, node_positions);
  parse_finish (c2m_ctx);
  context_finish (c2m_ctx);
  if (headers != NULL) VARR_DESTROY (char_ptr_t, headers);
  if (system_headers != NULL) VARR_DESTROY (char_ptr_t, system_headers);
  if (call_nodes != NULL) VARR_DESTROY (node_t, call_nodes);
  if (containing_anon_members != NULL) VARR_DESTROY (node_t, containing_anon_members);
  if (init_object_path != NULL) VARR_DESTROY (init_object_t, init_object_path);
}